

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraLcr.c
# Opt level: O2

Aig_Man_t *
Fra_FraigLatchCorrespondence
          (Aig_Man_t *pAig,int nFramesP,int nConfMax,int fProve,int fVerbose,int *pnIter,
          float TimeLimit)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  abctime aVar4;
  abctime aVar5;
  Aig_Man_t *pAVar6;
  Fra_Sml_t *p;
  abctime aVar7;
  Abc_Cex_t *pAVar8;
  Fra_Lcr_t *pLcr;
  Fra_Man_t *p_00;
  Fra_Cla_t *pFVar9;
  Vec_Ptr_t *pVVar10;
  Vec_Int_t *vPart;
  abctime aVar11;
  Aig_Man_t *pAVar12;
  void **ppvVar13;
  uint uVar14;
  int iVar15;
  uint uVar16;
  long local_50;
  
  aVar4 = Abc_Clock();
  if ((TimeLimit != 0.0) || (NAN(TimeLimit))) {
    aVar5 = Abc_Clock();
    local_50 = (long)(TimeLimit * 1e+06 + (float)aVar5);
  }
  else {
    local_50 = 0;
  }
  if (pAig->nObjs[6] + pAig->nObjs[5] == 0) {
    if (pnIter != (int *)0x0) {
      *pnIter = 0;
    }
    Aig_ManReprStart(pAig,pAig->vObjs->nSize);
    pAVar6 = Aig_ManDupOrdered(pAig);
    return pAVar6;
  }
  if (pAig->nRegs < 1) {
    __assert_fail("Aig_ManRegNum(pAig) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/fra/fraLcr.c"
                  ,0x226,
                  "Aig_Man_t *Fra_FraigLatchCorrespondence(Aig_Man_t *, int, int, int, int, int *, float)"
                 );
  }
  aVar5 = Abc_Clock();
  if (fVerbose != 0) {
    printf("Simulating AIG with %d nodes for %d cycles ...  ",
           (ulong)(uint)(pAig->nObjs[6] + pAig->nObjs[5]),(ulong)(nFramesP + 0x20));
  }
  pAVar6 = pAig;
  p = Fra_SmlSimulateSeq(pAig,nFramesP,0x20,1,1);
  iVar15 = (int)pAVar6;
  if (fVerbose != 0) {
    Abc_Print(iVar15,"%s =","Time");
    aVar7 = Abc_Clock();
    Abc_Print(iVar15,"%9.2f sec\n",(double)(aVar7 - aVar5) / 1000000.0);
  }
  aVar7 = Abc_Clock();
  if ((fProve == 0) || (p->fNonConstOut == 0)) {
    pLcr = Lcr_ManAlloc(pAig);
    pLcr->nFramesP = nFramesP;
    pLcr->fVerbose = fVerbose;
    pLcr->timeSim = pLcr->timeSim + (aVar7 - aVar5);
    p_00 = Fra_LcrAigPrepare(pAig);
    p_00->pBmc = (Fra_Bmc_t *)pLcr;
    p_00->pSml = p;
    pFVar9 = Fra_ClassesStart(pLcr->pAig);
    pLcr->pCla = pFVar9;
    p_00->pCla = pFVar9;
    iVar15 = 1;
    Fra_ClassesPrepare(pFVar9,1,0);
    pFVar9 = pLcr->pCla;
    pFVar9->pFuncNodeIsConst = Fra_LcrNodeIsConst;
    pFVar9->pFuncNodesAreEqual = Fra_LcrNodesAreEqual;
    Fra_SmlStop(p_00->pSml);
    aVar5 = Abc_Clock();
    if (fVerbose != 0) {
      printf("Partitioning AIG ...  ");
    }
    pAVar6 = Fra_LcrDeriveAigForPartitioning(pLcr);
    pVVar10 = Aig_ManPartitionSmart(pAVar6,200,0,(Vec_Ptr_t **)0x0);
    pLcr->vParts = pVVar10;
    Fra_LcrRemapPartitions(pVVar10,pLcr->pCla,pLcr->pInToOutPart,pLcr->pInToOutNum);
    Aig_ManStop(pAVar6);
    iVar2 = (int)pAVar6;
    if (fVerbose != 0) {
      Abc_Print(iVar2,"%s =","Time");
      aVar7 = Abc_Clock();
      Abc_Print(iVar2,"%9.2f sec\n",(double)(aVar7 - aVar5) / 1000000.0);
      aVar7 = Abc_Clock();
      pLcr->timePart = pLcr->timePart + (aVar7 - aVar5);
    }
    iVar2 = Fra_ClassesCountLits(pLcr->pCla);
    pLcr->nLitsBeg = iVar2;
    pAVar6 = pLcr->pAig;
    pLcr->nNodesBeg = pAVar6->nObjs[6] + pAVar6->nObjs[5];
    pLcr->nRegsBeg = pAVar6->nRegs;
    pLcr->fRefining = 1;
    uVar16 = 0;
    while (iVar15 != 0) {
      pLcr->fRefining = 0;
      aVar5 = Abc_Clock();
      Fra_ClassNodesMark(pLcr);
      pLcr->vFraigs->nSize = 0;
      iVar15 = 0;
LAB_004d96db:
      if (iVar15 < pLcr->vParts->nSize) {
        vPart = (Vec_Int_t *)Vec_PtrEntry(pLcr->vParts,iVar15);
        if (((TimeLimit == 0.0) && (!NAN(TimeLimit))) || (aVar7 = Abc_Clock(), aVar7 <= local_50))
        goto LAB_004d9716;
        for (iVar15 = 0; iVar15 < pLcr->vFraigs->nSize; iVar15 = iVar15 + 1) {
          pAVar6 = (Aig_Man_t *)Vec_PtrEntry(pLcr->vFraigs,iVar15);
          Aig_ManStop(pAVar6);
        }
        Aig_ManCleanMarkA(pAig);
        Aig_ManCleanMarkB(pAig);
        puts("Fra_FraigLatchCorrespondence(): Runtime limit exceeded.");
        pAVar6 = (Aig_Man_t *)0x0;
        goto LAB_004d9970;
      }
      Fra_ClassNodesUnmark(pLcr);
      if (fVerbose != 0) {
        pFVar9 = pLcr->pCla;
        uVar14 = pFVar9->vClasses1->nSize;
        uVar1 = pFVar9->vClasses->nSize;
        uVar3 = Fra_ClassesCountLits(pFVar9);
        iVar15 = 0x797edc;
        printf("%3d : Const = %6d. Class = %6d.  L = %6d. Part = %3d.  ",(ulong)uVar16,(ulong)uVar14
               ,(ulong)uVar1,(ulong)uVar3,(ulong)(uint)pLcr->vParts->nSize);
        Abc_Print(iVar15,"%s =","T");
        aVar7 = Abc_Clock();
        Abc_Print(iVar15,"%9.2f sec\n",(double)(aVar7 - aVar5) / 1000000.0);
      }
      Fra_LcrAigPrepareTwo(pLcr->pAig,p_00);
      iVar15 = Fra_ClassesRefine(pLcr->pCla);
      if (iVar15 != 0) {
        pLcr->fRefining = 1;
      }
      iVar15 = Fra_ClassesRefine1(pLcr->pCla,0,(int *)0x0);
      if (iVar15 != 0) {
        pLcr->fRefining = 1;
      }
      for (iVar15 = 0; iVar15 < pLcr->vFraigs->nSize; iVar15 = iVar15 + 1) {
        pAVar6 = (Aig_Man_t *)Vec_PtrEntry(pLcr->vFraigs,iVar15);
        Aig_ManStop(pAVar6);
      }
      aVar5 = Abc_Clock();
      Vec_VecFree((Vec_Vec_t *)pLcr->vParts);
      pAVar6 = Fra_LcrDeriveAigForPartitioning(pLcr);
      pVVar10 = Aig_ManPartitionSmart(pAVar6,200,0,(Vec_Ptr_t **)0x0);
      pLcr->vParts = pVVar10;
      Fra_LcrRemapPartitions(pVVar10,pLcr->pCla,pLcr->pInToOutPart,pLcr->pInToOutNum);
      Aig_ManStop(pAVar6);
      aVar7 = Abc_Clock();
      pLcr->timePart = pLcr->timePart + (aVar7 - aVar5);
      uVar16 = uVar16 + 1;
      iVar15 = pLcr->fRefining;
    }
    pLcr->nIters = uVar16;
    aVar5 = Abc_Clock();
    Fra_ClassesCopyReprs(pLcr->pCla,(Vec_Ptr_t *)0x0);
    pAVar6 = Aig_ManDupRepr(pLcr->pAig,0);
    Aig_ManSeqCleanup(pAVar6);
    aVar7 = Abc_Clock();
    pLcr->timeUpdate = pLcr->timeUpdate + (aVar7 - aVar5);
    aVar5 = Abc_Clock();
    pLcr->timeTotal = aVar5 - aVar4;
    iVar15 = Fra_ClassesCountLits(pLcr->pCla);
    pLcr->nLitsEnd = iVar15;
    pLcr->nNodesEnd = pAVar6->nObjs[6] + pAVar6->nObjs[5];
    pLcr->nRegsEnd = pAVar6->nRegs;
LAB_004d9970:
    free(p_00);
    Lcr_ManFree(pLcr);
    if (pnIter != (int *)0x0) {
      *pnIter = uVar16;
    }
  }
  else {
    pAVar8 = Fra_SmlGetCounterExample(p);
    pAig->pSeqModel = pAVar8;
    Fra_SmlStop(p);
    pAVar6 = (Aig_Man_t *)0x0;
  }
  return pAVar6;
LAB_004d9716:
  aVar7 = Abc_Clock();
  pAVar6 = Fra_LcrCreatePart(pLcr,vPart);
  aVar11 = Abc_Clock();
  pLcr->timeTrav = pLcr->timeTrav + (aVar11 - aVar7);
  aVar7 = Abc_Clock();
  pAVar12 = Fra_FraigEquivence(pAVar6,nConfMax,0);
  aVar11 = Abc_Clock();
  pLcr->timeFraig = pLcr->timeFraig + (aVar11 - aVar7);
  pVVar10 = pLcr->vFraigs;
  iVar2 = pVVar10->nSize;
  if (iVar2 == pVVar10->nCap) {
    uVar14 = iVar2 * 2;
    if (iVar2 < 0x10) {
      uVar14 = 0x10;
    }
    if (iVar2 < (int)uVar14) {
      if (pVVar10->pArray == (void **)0x0) {
        ppvVar13 = (void **)malloc((ulong)uVar14 << 3);
      }
      else {
        ppvVar13 = (void **)realloc(pVVar10->pArray,(ulong)uVar14 << 3);
        iVar2 = pVVar10->nSize;
      }
      pVVar10->pArray = ppvVar13;
      pVVar10->nCap = uVar14;
    }
  }
  pVVar10->nSize = iVar2 + 1;
  pVVar10->pArray[iVar2] = pAVar12;
  Aig_ManStop(pAVar6);
  iVar15 = iVar15 + 1;
  goto LAB_004d96db;
}

Assistant:

Aig_Man_t * Fra_FraigLatchCorrespondence( Aig_Man_t * pAig, int nFramesP, int nConfMax, int fProve, int fVerbose, int * pnIter, float TimeLimit )
{
    int nPartSize    = 200;
    int fReprSelect  = 0;
    Fra_Lcr_t * p;
    Fra_Sml_t * pSml;
    Fra_Man_t * pTemp;
    Aig_Man_t * pAigPart, * pAigTemp, * pAigNew = NULL;
    Vec_Int_t * vPart;
    int i, nIter;
    abctime timeSim, clk2, clk3, clk = Abc_Clock();
    abctime TimeToStop = TimeLimit ? TimeLimit * CLOCKS_PER_SEC + Abc_Clock() : 0;
    if ( Aig_ManNodeNum(pAig) == 0 )
    {
        if ( pnIter ) *pnIter = 0;
        // Ntl_ManFinalize() requires the following to satisfy an assertion.
        Aig_ManReprStart(pAig,Aig_ManObjNumMax(pAig));
        return Aig_ManDupOrdered(pAig);
    }
    assert( Aig_ManRegNum(pAig) > 0 ); 

    // simulate the AIG 
clk2 = Abc_Clock();
if ( fVerbose )
printf( "Simulating AIG with %d nodes for %d cycles ...  ", Aig_ManNodeNum(pAig), nFramesP + 32 );
    pSml = Fra_SmlSimulateSeq( pAig, nFramesP, 32, 1, 1  ); 
if ( fVerbose ) 
{
ABC_PRT( "Time", Abc_Clock() - clk2 );
}
timeSim = Abc_Clock() - clk2;

    // check if simulation discovered non-constant-0 POs
    if ( fProve && pSml->fNonConstOut )
    {
        pAig->pSeqModel = Fra_SmlGetCounterExample( pSml );
        Fra_SmlStop( pSml );
        return NULL;
    }

    // start the manager
    p = Lcr_ManAlloc( pAig );
    p->nFramesP = nFramesP;
    p->fVerbose = fVerbose;
    p->timeSim += timeSim;

    pTemp = Fra_LcrAigPrepare( pAig );
    pTemp->pBmc = (Fra_Bmc_t *)p;
    pTemp->pSml = pSml;

    // get preliminary info about equivalence classes
    pTemp->pCla = p->pCla = Fra_ClassesStart( p->pAig );
    Fra_ClassesPrepare( p->pCla, 1, 0 );
    p->pCla->pFuncNodeIsConst   = Fra_LcrNodeIsConst;
    p->pCla->pFuncNodesAreEqual = Fra_LcrNodesAreEqual;
    Fra_SmlStop( pTemp->pSml );

    // partition the AIG for latch correspondence computation
clk2 = Abc_Clock();
if ( fVerbose )
printf( "Partitioning AIG ...  " );
    pAigPart = Fra_LcrDeriveAigForPartitioning( p );
    p->vParts = (Vec_Ptr_t *)Aig_ManPartitionSmart( pAigPart, nPartSize, 0, NULL );
    Fra_LcrRemapPartitions( p->vParts, p->pCla, p->pInToOutPart, p->pInToOutNum );
    Aig_ManStop( pAigPart );
if ( fVerbose ) 
{
ABC_PRT( "Time", Abc_Clock() - clk2 );
p->timePart += Abc_Clock() - clk2;
}

    // get the initial stats
    p->nLitsBeg  = Fra_ClassesCountLits( p->pCla );
    p->nNodesBeg = Aig_ManNodeNum(p->pAig);
    p->nRegsBeg  = Aig_ManRegNum(p->pAig);

    // perforn interative reduction of the partitions
    p->fRefining = 1;
    for ( nIter = 0; p->fRefining; nIter++ )
    {
        p->fRefining = 0;
        clk3 = Abc_Clock();
        // derive AIGs for each partition
        Fra_ClassNodesMark( p );
        Vec_PtrClear( p->vFraigs );
        Vec_PtrForEachEntry( Vec_Int_t *, p->vParts, vPart, i )
        {
            if ( TimeLimit != 0.0 && Abc_Clock() > TimeToStop )
            {
                Vec_PtrForEachEntry( Aig_Man_t *, p->vFraigs, pAigPart, i )
                    Aig_ManStop( pAigPart );
                Aig_ManCleanMarkA( pAig );
                Aig_ManCleanMarkB( pAig );
                printf( "Fra_FraigLatchCorrespondence(): Runtime limit exceeded.\n" );
                goto finish;
            }
clk2 = Abc_Clock();
            pAigPart = Fra_LcrCreatePart( p, vPart );
p->timeTrav += Abc_Clock() - clk2;
clk2 = Abc_Clock();
            pAigTemp  = Fra_FraigEquivence( pAigPart, nConfMax, 0 );
p->timeFraig += Abc_Clock() - clk2;
            Vec_PtrPush( p->vFraigs, pAigTemp );
/*
            {
                char Name[1000];
                sprintf( Name, "part%04d.blif", i );
                Aig_ManDumpBlif( pAigPart, Name, NULL, NULL );
            }
printf( "Finished part %4d (out of %4d).  ", i, Vec_PtrSize(p->vParts) );
ABC_PRT( "Time", Abc_Clock() - clk3 );
*/

            Aig_ManStop( pAigPart );
        }
        Fra_ClassNodesUnmark( p );
        // report the intermediate results
        if ( fVerbose )
        {
            printf( "%3d : Const = %6d. Class = %6d.  L = %6d. Part = %3d.  ", 
                nIter, Vec_PtrSize(p->pCla->vClasses1), Vec_PtrSize(p->pCla->vClasses), 
                Fra_ClassesCountLits(p->pCla), Vec_PtrSize(p->vParts) );
            ABC_PRT( "T", Abc_Clock() - clk3 );
        }
        // refine the classes
        Fra_LcrAigPrepareTwo( p->pAig, pTemp );
        if ( Fra_ClassesRefine( p->pCla ) )
            p->fRefining = 1;
        if ( Fra_ClassesRefine1( p->pCla, 0, NULL ) )
            p->fRefining = 1;
        // clean the fraigs
        Vec_PtrForEachEntry( Aig_Man_t *, p->vFraigs, pAigPart, i )
            Aig_ManStop( pAigPart );

        // repartition if needed
        if ( 1 )
        {
clk2 = Abc_Clock();
            Vec_VecFree( (Vec_Vec_t *)p->vParts );
            pAigPart = Fra_LcrDeriveAigForPartitioning( p );
            p->vParts = (Vec_Ptr_t *)Aig_ManPartitionSmart( pAigPart, nPartSize, 0, NULL );
            Fra_LcrRemapPartitions( p->vParts, p->pCla, p->pInToOutPart, p->pInToOutNum );
            Aig_ManStop( pAigPart );
p->timePart += Abc_Clock() - clk2;
        }
    }
    p->nIters = nIter;

    // move the classes into representatives and reduce AIG
clk2 = Abc_Clock();
//    Fra_ClassesPrint( p->pCla, 1 );
    if ( fReprSelect )
        Fra_ClassesSelectRepr( p->pCla );
    Fra_ClassesCopyReprs( p->pCla, NULL );
    pAigNew = Aig_ManDupRepr( p->pAig, 0 );
    Aig_ManSeqCleanup( pAigNew );
//    Aig_ManCountMergeRegs( pAigNew );
p->timeUpdate += Abc_Clock() - clk2;
p->timeTotal = Abc_Clock() - clk;
    // get the final stats
    p->nLitsEnd  = Fra_ClassesCountLits( p->pCla );
    p->nNodesEnd = Aig_ManNodeNum(pAigNew);
    p->nRegsEnd  = Aig_ManRegNum(pAigNew);
finish:
    ABC_FREE( pTemp );
    Lcr_ManFree( p );
    if ( pnIter ) *pnIter = nIter;
    return pAigNew;
}